

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CompleteInsertion
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int regNewData,int *aRegIdx,
               int update_flags,int appendBias,int useSeekResult)

{
  Vdbe *p;
  Op *pOVar1;
  int iVar2;
  u16 uVar3;
  byte bVar4;
  ushort uVar5;
  u16 uVar6;
  Index *pIVar7;
  ushort uVar8;
  ulong uVar9;
  
  p = pParse->pVdbe;
  pIVar7 = pTab->pIndex;
  if (pIVar7 == (Index *)0x0) {
    uVar9 = 0;
  }
  else {
    bVar4 = (useSeekResult != 0) << 4;
    uVar9 = 0;
    do {
      if (aRegIdx[uVar9] != 0) {
        if (pIVar7->pPartIdxWhere != (Expr *)0x0) {
          sqlite3VdbeAddOp3(p,0x32,aRegIdx[uVar9],p->nOp + 2,0);
        }
        uVar8 = (ushort)bVar4;
        if ((*(ushort *)&pIVar7->field_0x63 & 3) == 2) {
          uVar8 = (ushort)(byte)(((byte)update_flags & 2 | bVar4) + 1);
          if ((pTab->tabFlags & 0x80) == 0) {
            uVar8 = (ushort)bVar4;
          }
        }
        uVar5 = (&pIVar7->nKeyCol)[(*(ushort *)&pIVar7->field_0x63 & 8) == 0];
        iVar2 = sqlite3VdbeAddOp3(p,0x8a,iIdxCur + (int)uVar9,aRegIdx[uVar9],aRegIdx[uVar9] + 1);
        if (p->db->mallocFailed == '\0') {
          pOVar1 = p->aOp;
          pOVar1[iVar2].p4type = -3;
          *(uint *)&pOVar1[iVar2].p4 = (uint)uVar5;
        }
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = uVar8;
        }
      }
      uVar9 = uVar9 + 1;
      pIVar7 = pIVar7->pNext;
    } while (pIVar7 != (Index *)0x0);
    uVar9 = uVar9 & 0xffffffff;
  }
  if ((pTab->tabFlags & 0x80) == 0) {
    uVar6 = 0x21;
    if (update_flags != 0) {
      uVar6 = (ushort)(byte)((byte)update_flags | 1);
    }
    uVar3 = 0;
    if (pParse->nested == '\0') {
      uVar3 = uVar6;
    }
    uVar8 = (ushort)(byte)((byte)uVar3 | 8);
    if (appendBias == 0) {
      uVar8 = uVar3;
    }
    uVar5 = (ushort)(byte)((byte)uVar8 | 0x10);
    if (useSeekResult == 0) {
      uVar5 = uVar8;
    }
    sqlite3VdbeAddOp3(p,0x80,iDataCur,aRegIdx[uVar9],regNewData);
    if ((pParse->nested == '\0') && (p->db->mallocFailed == '\0')) {
      pOVar1 = p->aOp;
      iVar2 = p->nOp;
      pOVar1[(long)iVar2 + -1].p4type = -5;
      pOVar1[(long)iVar2 + -1].p4.pTab = pTab;
    }
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = uVar5;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CompleteInsertion(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int iDataCur,       /* Cursor of the canonical data source */
  int iIdxCur,        /* First index cursor */
  int regNewData,     /* Range of content */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int update_flags,   /* True for UPDATE, False for INSERT */
  int appendBias,     /* True if this is likely to be an append */
  int useSeekResult   /* True to set the USESEEKRESULT flag on OP_[Idx]Insert */
){
  Vdbe *v;            /* Prepared statements under construction */
  Index *pIdx;        /* An index being inserted or updated */
  u8 pik_flags;       /* flag values passed to the btree insert */
  int i;              /* Loop counter */

  assert( update_flags==0
       || update_flags==OPFLAG_ISUPDATE
       || update_flags==(OPFLAG_ISUPDATE|OPFLAG_SAVEPOSITION)
  );

  v = pParse->pVdbe;
  assert( v!=0 );
  assert( !IsView(pTab) );  /* This table is not a VIEW */
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    /* All REPLACE indexes are at the end of the list */
    assert( pIdx->onError!=OE_Replace
         || pIdx->pNext==0
         || pIdx->pNext->onError==OE_Replace );
    if( aRegIdx[i]==0 ) continue;
    if( pIdx->pPartIdxWhere ){
      sqlite3VdbeAddOp2(v, OP_IsNull, aRegIdx[i], sqlite3VdbeCurrentAddr(v)+2);
      VdbeCoverage(v);
    }
    pik_flags = (useSeekResult ? OPFLAG_USESEEKRESULT : 0);
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      pik_flags |= OPFLAG_NCHANGE;
      pik_flags |= (update_flags & OPFLAG_SAVEPOSITION);
      if( update_flags==0 ){
        codeWithoutRowidPreupdate(pParse, pTab, iIdxCur+i, aRegIdx[i]);
      }
    }
    sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iIdxCur+i, aRegIdx[i],
                         aRegIdx[i]+1,
                         pIdx->uniqNotNull ? pIdx->nKeyCol: pIdx->nColumn);
    sqlite3VdbeChangeP5(v, pik_flags);
  }
  if( !HasRowid(pTab) ) return;
  if( pParse->nested ){
    pik_flags = 0;
  }else{
    pik_flags = OPFLAG_NCHANGE;
    pik_flags |= (update_flags?update_flags:OPFLAG_LASTROWID);
  }
  if( appendBias ){
    pik_flags |= OPFLAG_APPEND;
  }
  if( useSeekResult ){
    pik_flags |= OPFLAG_USESEEKRESULT;
  }
  sqlite3VdbeAddOp3(v, OP_Insert, iDataCur, aRegIdx[i], regNewData);
  if( !pParse->nested ){
    sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
  }
  sqlite3VdbeChangeP5(v, pik_flags);
}